

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_entityboss.cpp
# Opt level: O2

int AF_A_EntityAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  AActor *self;
  VMValue params [3];
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0054b8d3;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_0054b71c:
        self = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054b8d3;
        }
      }
      if (numparam != 1) {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_0054b8c3;
          this = (DObject *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if ((this != (DObject *)0x0) &&
               (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
              pcVar5 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054b8d3;
            }
          }
          else if (this != (DObject *)0x0) goto LAB_0054b8c3;
        }
        if (((2 < (uint)numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
           ((VVar1 != '\x03' ||
            ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0))))))
        {
          pcVar5 = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
          ;
          goto LAB_0054b8d3;
        }
      }
      iVar3 = FRandom::operator()(&pr_entity);
      params[0].field_0._0_8_ = self;
      params[1].field_0._0_8_ = self;
      switch((long)iVar3 % 5 & 0xffffffff) {
      case 0:
        params[0].field_0._8_4_ = 1;
        params[0].field_0.field_3.Type = '\x03';
        params[1].field_0.field_3.Type = '\x03';
        params[2].field_0.field_1.a = (void *)0x0;
        params[2].field_0.field_1.atag = 8;
        params[2].field_0.field_3.Type = '\x03';
        params[1].field_0._8_4_ = params[0].field_0._8_4_;
        VMFrameStack::Call(stack,&A_SpotLightning_VMPtr->super_VMFunction,params,3,(VMReturn *)0x0,0
                           ,(VMException **)0x0);
        lVar4 = 0x20;
        do {
          VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar4));
          lVar4 = lVar4 + -0x10;
        } while (lVar4 != -0x10);
        return 0;
      case 1:
        pcVar5 = "SpectralLightningBigBall2";
        break;
      case 2:
        pcVar5 = "SpectralLightningH3";
        break;
      case 3:
        params[0].field_0._8_4_ = 1;
        params[0].field_0.field_3.Type = '\x03';
        params[1].field_0.field_3.Type = '\x03';
        params[2].field_0.field_1.a = (void *)0x0;
        params[2].field_0.field_1.atag = 8;
        params[2].field_0.field_3.Type = '\x03';
        params[1].field_0._8_4_ = params[0].field_0._8_4_;
        VMFrameStack::Call(stack,&A_Spectre3Attack_VMPtr->super_VMFunction,params,3,(VMReturn *)0x0,
                           0,(VMException **)0x0);
        lVar4 = 0x20;
        do {
          VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar4));
          lVar4 = lVar4 + -0x10;
        } while (lVar4 != -0x10);
        return 0;
      case 4:
        pcVar5 = "SpectralLightningBigV2";
        break;
      default:
        goto switchD_0054b7c6_default;
      }
      A_SpectralMissile(self,pcVar5);
switchD_0054b7c6_default:
      return 0;
    }
    if (self == (AActor *)0x0) goto LAB_0054b71c;
  }
LAB_0054b8c3:
  pcVar5 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054b8d3:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_entityboss.cpp"
                ,0x2d,"int AF_A_EntityAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_EntityAttack)
{
	PARAM_ACTION_PROLOGUE;

	// Apparent Strife bug: Case 5 was unreachable because they used % 5 instead of % 6.
	// I've fixed that by making case 1 duplicate it, since case 1 did nothing.
	switch (pr_entity() % 5)
	{
	case 0:
		CALL_ACTION(A_SpotLightning, self);
		break;

	case 2:
		A_SpectralMissile (self, "SpectralLightningH3");
		break;

	case 3:
		CALL_ACTION(A_Spectre3Attack, self);
		break;

	case 4:
		A_SpectralMissile (self, "SpectralLightningBigV2");
		break;

	case 1:
	case 5:
		A_SpectralMissile (self, "SpectralLightningBigBall2");
		break;
	}
	return 0;
}